

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void google::protobuf::compiler::anon_unknown_0::GatherOccupiedFieldRanges
               (Descriptor *descriptor,
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges,vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *nested_messages)

{
  pointer *pppDVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  iterator __position;
  _Base_ptr p_Var6;
  Type TVar7;
  _Base_ptr p_Var8;
  FieldDescriptor *this;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  long lVar12;
  Descriptor *nested_desc;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  pair<int,_int> local_68;
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      lVar3 = *(long *)(descriptor + 0x30);
      local_68.first = *(int *)(lVar3 + 0x38 + lVar12);
      local_68.second = local_68.first + 1;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_68);
      this = (FieldDescriptor *)(lVar3 + lVar12);
      TVar7 = FieldDescriptor::type(this);
      if (TVar7 == TYPE_GROUP) {
        local_68 = (pair<int,_int>)FieldDescriptor::message_type(this);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&local_60,(Descriptor **)&local_68);
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0xa8;
    } while (lVar11 < *(int *)(descriptor + 0x2c));
  }
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar11 = 0;
    do {
      local_68.second = *(int *)(*(long *)(descriptor + 0x70) + 4 + lVar11 * 8);
      local_68.first = *(int *)(*(long *)(descriptor + 0x70) + lVar11 * 8);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_68);
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(descriptor + 0x68));
  }
  if (0 < *(int *)(descriptor + 0x88)) {
    lVar11 = 0;
    do {
      local_68.second = *(int *)(*(long *)(descriptor + 0x90) + 4 + lVar11 * 8);
      local_68.first = *(int *)(*(long *)(descriptor + 0x90) + lVar11 * 8);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_68);
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(descriptor + 0x88));
  }
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar11 = 0;
    do {
      local_68 = (pair<int,_int>)(lVar11 * 0xa8 + *(long *)(descriptor + 0x50));
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var2->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002086a3:
        __position._M_current =
             (nested_messages->
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (nested_messages->
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)nested_messages,__position,(Descriptor **)&local_68);
        }
        else {
          *__position._M_current = (Descriptor *)local_68;
          pppDVar1 = &(nested_messages->
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + 1;
        }
      }
      else {
        do {
          p_Var9 = p_Var10;
          p_Var8 = p_Var6;
          pVar4.first = p_Var8[1]._M_color;
          pVar4.second = *(int *)&p_Var8[1].field_0x4;
          p_Var10 = p_Var8;
          if ((ulong)pVar4 < (ulong)local_68) {
            p_Var10 = p_Var9;
          }
          p_Var6 = (&p_Var8->_M_left)[(ulong)pVar4 < (ulong)local_68];
        } while ((&p_Var8->_M_left)[(ulong)pVar4 < (ulong)local_68] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var10 == p_Var2) goto LAB_002086a3;
        if ((ulong)pVar4 < (ulong)local_68) {
          p_Var8 = p_Var9;
        }
        pVar5.first = p_Var8[1]._M_color;
        pVar5.second = *(int *)&p_Var8[1].field_0x4;
        if ((ulong)local_68 < (ulong)pVar5) goto LAB_002086a3;
        GatherOccupiedFieldRanges((Descriptor *)local_68,ranges,nested_messages);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(descriptor + 0x48));
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void GatherOccupiedFieldRanges(
    const Descriptor* descriptor, std::set<FieldRange>* ranges,
    std::vector<const Descriptor*>* nested_messages) {
  std::set<const Descriptor*> groups;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* fd = descriptor->field(i);
    ranges->insert(FieldRange(fd->number(), fd->number() + 1));
    if (fd->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(fd->message_type());
    }
  }
  for (int i = 0; i < descriptor->extension_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->extension_range(i)->start,
                              descriptor->extension_range(i)->end));
  }
  for (int i = 0; i < descriptor->reserved_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->reserved_range(i)->start,
                              descriptor->reserved_range(i)->end));
  }
  // Handle the nested messages/groups in declaration order to make it
  // post-order strict.
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    const Descriptor* nested_desc = descriptor->nested_type(i);
    if (groups.find(nested_desc) != groups.end()) {
      GatherOccupiedFieldRanges(nested_desc, ranges, nested_messages);
    } else {
      nested_messages->push_back(nested_desc);
    }
  }
}